

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O0

void Abc_NtkTimeSetDefaultRequired(Abc_Ntk_t *pNtk,float Rise,float Fall)

{
  int iVar1;
  uint ObjId;
  Abc_ManTime_t *pAVar2;
  Abc_Obj_t *pObj_00;
  int local_24;
  int i;
  Abc_Obj_t *pObj;
  float Fall_local;
  float Rise_local;
  Abc_Ntk_t *pNtk_local;
  
  if (pNtk->pManTime == (Abc_ManTime_t *)0x0) {
    pAVar2 = Abc_ManTimeStart(pNtk);
    pNtk->pManTime = pAVar2;
  }
  (pNtk->pManTime->tReqDef).Rise = Rise;
  (pNtk->pManTime->tReqDef).Fall = Fall;
  for (local_24 = 0; iVar1 = Abc_NtkCoNum(pNtk), local_24 < iVar1; local_24 = local_24 + 1) {
    pObj_00 = Abc_NtkCo(pNtk,local_24);
    ObjId = Abc_ObjId(pObj_00);
    Abc_NtkTimeSetRequired(pNtk,ObjId,Rise,Fall);
  }
  return;
}

Assistant:

void Abc_NtkTimeSetDefaultRequired( Abc_Ntk_t * pNtk, float Rise, float Fall )
{
    Abc_Obj_t * pObj; int i;
    if ( pNtk->pManTime == NULL )
        pNtk->pManTime = Abc_ManTimeStart(pNtk);
    pNtk->pManTime->tReqDef.Rise  = Rise;
    pNtk->pManTime->tReqDef.Fall  = Fall;
    // set the required times for each output
    Abc_NtkForEachCo( pNtk, pObj, i )
        Abc_NtkTimeSetRequired( pNtk, Abc_ObjId(pObj), Rise, Fall );        
}